

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O3

PianoWidget * __thiscall PianoWidget::getPixmap(PianoWidget *this,Pixmaps id)

{
  char cVar1;
  storage_type *psVar2;
  uint in_EDX;
  QByteArrayView QVar3;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  QPixmap::QPixmap((QPixmap *)this);
  if (*(char **)(PianoWidgetTU::PIXMAP_PATHS + (ulong)in_EDX * 8) == (char *)0x0) {
    psVar2 = (storage_type *)0x0;
  }
  else {
    psVar2 = (storage_type *)strlen(*(char **)(PianoWidgetTU::PIXMAP_PATHS + (ulong)in_EDX * 8));
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  cVar1 = QPixmapCache::find(&local_58,(QPixmap *)this);
  if (cVar1 == '\0') {
    QPixmap::load(this,&local_58,0,0);
    QPixmapCache::insert(&local_58,(QPixmap *)this);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  return this;
}

Assistant:

QPixmap PianoWidget::getPixmap(Pixmaps id) {
    QPixmap pixmap;
    QString const key = TU::PIXMAP_PATHS[id];
    if (!QPixmapCache::find(key, &pixmap)) {
        pixmap.load(key);
        QPixmapCache::insert(key, pixmap);
    }
    return pixmap;
}